

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_reinit(ps_decoder_t *ps,ps_config_t *config)

{
  int iVar1;
  ps_config_t *ppVar2;
  char *pcVar3;
  hash_table_t *phVar4;
  char **ppcVar5;
  ps_arg_t *defn;
  logmath_t *plVar6;
  acmod_t *paVar7;
  long lVar8;
  ps_search_t *ppVar9;
  dict_t *pdVar10;
  dict2pid_t *pdVar11;
  ngram_model_t *base;
  ngram_model_t *lm_00;
  float64 fVar12;
  double dVar13;
  ngram_model_t *lm;
  ngram_model_set_iter_t *lmset_it;
  ngram_model_t *lmset;
  char *name;
  fsg_model_t *fsg;
  char *loglevel;
  char *logfn;
  char *pcStack_30;
  int32 lw;
  char *keyphrase;
  char *path;
  ps_config_t *config_local;
  ps_decoder_t *ps_local;
  
  path = (char *)config;
  config_local = (ps_config_t *)ps;
  if (config == (ps_config_t *)0x0) {
    if ((ps->config != (cmd_ln_t *)0x0) && (iVar1 = ps_config_validate(ps->config), iVar1 < 0)) {
      return -1;
    }
  }
  else {
    iVar1 = ps_config_validate(config);
    if (iVar1 < 0) {
      return -1;
    }
  }
  if ((path != (char *)0x0) && (path != *(char **)config_local)) {
    ps_config_free(*(ps_config_t **)config_local);
    ppVar2 = ps_config_retain((ps_config_t *)path);
    *(ps_config_t **)config_local = ppVar2;
  }
  if (path != (char *)0x0) {
    loglevel = ps_config_str(*(cmd_ln_t **)config_local,"logfn");
    if ((loglevel != (char *)0x0) && (iVar1 = err_set_logfile(loglevel), iVar1 < 0)) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
              ,0x105,"Cannot redirect log output\n");
      return -1;
    }
    fsg = (fsg_model_t *)ps_config_str(*(cmd_ln_t **)config_local,"loglevel");
    if ((fsg != (fsg_model_t *)0x0) &&
       (pcVar3 = err_set_loglevel_str((char *)fsg), pcVar3 == (char *)0x0)) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
              ,0x10c,"Invalid log level: %s\n",fsg);
      return -1;
    }
  }
  pcVar3 = ps_config_str(*(cmd_ln_t **)config_local,"mfclogdir");
  *(char **)(config_local + 3) = pcVar3;
  phVar4 = (hash_table_t *)ps_config_str(*(cmd_ln_t **)config_local,"rawlogdir");
  config_local[3].ht = phVar4;
  ppcVar5 = (char **)ps_config_str(*(cmd_ln_t **)config_local,"senlogdir");
  config_local[3].f_argv = ppcVar5;
  ps_expand_model_config(*(ps_config_t **)config_local);
  ppVar2 = *(ps_config_t **)config_local;
  defn = ps_args();
  cmd_ln_log_values_r(ppVar2,defn);
  ps_free_searches((ps_decoder_t *)config_local);
  phVar4 = hash_table_new(3,0);
  *(hash_table_t **)(config_local + 1) = phVar4;
  acmod_free((acmod_t *)config_local->f_argv);
  config_local->f_argv = (char **)0x0;
  dict_free(*(dict_t **)&config_local->f_argc);
  *(undefined8 *)&config_local->f_argc = 0;
  dict2pid_free((dict2pid_t *)config_local->defn);
  config_local->defn = (ps_arg_t *)0x0;
  if (config_local->json != (char *)0x0) {
    fVar12 = logmath_get_base((logmath_t *)config_local->json);
    dVar13 = ps_config_float(*(ps_config_t **)config_local,"logbase");
    if (((double)fVar12 == dVar13) && (!NAN((double)fVar12) && !NAN(dVar13))) goto LAB_0010e082;
  }
  if (config_local->json != (char *)0x0) {
    logmath_free((logmath_t *)config_local->json);
  }
  dVar13 = ps_config_float(*(ps_config_t **)config_local,"logbase");
  plVar6 = logmath_init((float64)dVar13,0,1);
  config_local->json = (char *)plVar6;
LAB_0010e082:
  paVar7 = acmod_init(*(ps_config_t **)config_local,(logmath_t *)config_local->json,(fe_t *)0x0,
                      (feat_t *)0x0);
  config_local->f_argv = (char **)paVar7;
  if (paVar7 == (acmod_t *)0x0) {
    ps_local._4_4_ = -1;
  }
  else {
    lVar8 = ps_config_int(*(cmd_ln_t **)config_local,"pl_window");
    if (0 < lVar8) {
      ppVar9 = phone_loop_search_init
                         (*(cmd_ln_t **)config_local,(acmod_t *)config_local->f_argv,
                          *(dict_t **)&config_local->f_argc);
      config_local[1].f_argv = (char **)ppVar9;
      if (ppVar9 == (ps_search_t *)0x0) {
        return -1;
      }
      hash_table_enter(*(hash_table_t **)(config_local + 1),config_local[1].f_argv[2],
                       config_local[1].f_argv);
    }
    pdVar10 = dict_init(*(ps_config_t **)config_local,(bin_mdef_t *)config_local->f_argv[5]);
    *(dict_t **)&config_local->f_argc = pdVar10;
    if (pdVar10 == (dict_t *)0x0) {
      ps_local._4_4_ = -1;
    }
    else {
      pdVar11 = dict2pid_build((bin_mdef_t *)config_local->f_argv[5],
                               *(dict_t **)&config_local->f_argc);
      config_local->defn = (ps_arg_t *)pdVar11;
      if (pdVar11 == (dict2pid_t *)0x0) {
        ps_local._4_4_ = -1;
      }
      else {
        dVar13 = ps_config_float(*(ps_config_t **)config_local,"lw");
        logfn._4_4_ = (int)dVar13;
        pcStack_30 = ps_config_str(*(cmd_ln_t **)config_local,"keyphrase");
        if (pcStack_30 == (char *)0x0) {
          keyphrase = ps_config_str(*(cmd_ln_t **)config_local,"kws");
          if (keyphrase == (char *)0x0) {
            keyphrase = ps_config_str(*(cmd_ln_t **)config_local,"fsg");
            if (keyphrase == (char *)0x0) {
              keyphrase = ps_config_str(*(cmd_ln_t **)config_local,"jsgf");
              if (keyphrase == (char *)0x0) {
                keyphrase = ps_config_str(*(cmd_ln_t **)config_local,"allphone");
                if (keyphrase == (char *)0x0) {
                  keyphrase = ps_config_str(*(cmd_ln_t **)config_local,"lm");
                  if (keyphrase == (char *)0x0) {
                    keyphrase = ps_config_str(*(cmd_ln_t **)config_local,"lmctl");
                    if (keyphrase != (char *)0x0) {
                      base = ngram_model_set_read
                                       (*(ps_config_t **)config_local,keyphrase,
                                        (logmath_t *)config_local->json);
                      if (base == (ngram_model_t *)0x0) {
                        err_msg(ERR_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                                ,0x17c,"Failed to read language model control file: %s\n",keyphrase)
                        ;
                        return -1;
                      }
                      for (lm = (ngram_model_t *)ngram_model_set_iter(base);
                          lm != (ngram_model_t *)0x0;
                          lm = (ngram_model_t *)
                               ngram_model_set_iter_next((ngram_model_set_iter_t *)lm)) {
                        lm_00 = ngram_model_set_iter_model
                                          ((ngram_model_set_iter_t *)lm,(char **)&lmset);
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                                ,0x183,"adding search %s\n",lmset);
                        iVar1 = ps_add_lm((ps_decoder_t *)config_local,(char *)lmset,lm_00);
                        if (iVar1 != 0) {
                          ngram_model_set_iter_free((ngram_model_set_iter_t *)lm);
                          ngram_model_free(base);
                          return -1;
                        }
                      }
                      ngram_model_free(base);
                      lmset = (ngram_model_t *)ps_config_str(*(cmd_ln_t **)config_local,"lmname");
                      if (lmset == (ngram_model_t *)0x0) {
                        err_msg(ERR_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                                ,400,"No default LM name (-lmname) for `-lmctl\'\n");
                        return -1;
                      }
                      ps_activate_search((ps_decoder_t *)config_local,(char *)lmset);
                    }
                  }
                  else {
                    iVar1 = ps_add_lm_file((ps_decoder_t *)config_local,"_default",keyphrase);
                    if ((iVar1 != 0) ||
                       (iVar1 = ps_activate_search((ps_decoder_t *)config_local,"_default"),
                       iVar1 != 0)) {
                      return -1;
                    }
                  }
                }
                else {
                  iVar1 = ps_add_allphone_file((ps_decoder_t *)config_local,"_default",keyphrase);
                  if ((iVar1 != 0) ||
                     (iVar1 = ps_activate_search((ps_decoder_t *)config_local,"_default"),
                     iVar1 != 0)) {
                    return -1;
                  }
                }
              }
              else {
                iVar1 = ps_add_jsgf_file((ps_decoder_t *)config_local,"_default",keyphrase);
                if ((iVar1 != 0) ||
                   (iVar1 = ps_activate_search((ps_decoder_t *)config_local,"_default"), iVar1 != 0)
                   ) {
                  return -1;
                }
              }
            }
            else {
              name = (char *)fsg_model_readfile(keyphrase,(logmath_t *)config_local->json,
                                                (float32)(float)logfn._4_4_);
              if ((fsg_model_t *)name == (fsg_model_t *)0x0) {
                return -1;
              }
              iVar1 = ps_add_fsg((ps_decoder_t *)config_local,"_default",(fsg_model_t *)name);
              if (iVar1 != 0) {
                fsg_model_free((fsg_model_t *)name);
                return -1;
              }
              fsg_model_free((fsg_model_t *)name);
              ps_activate_search((ps_decoder_t *)config_local,"_default");
            }
          }
          else {
            iVar1 = ps_add_kws((ps_decoder_t *)config_local,"_default",keyphrase);
            if (iVar1 != 0) {
              return -1;
            }
            ps_activate_search((ps_decoder_t *)config_local,"_default");
          }
        }
        else {
          iVar1 = ps_add_keyphrase((ps_decoder_t *)config_local,"_default",pcStack_30);
          if (iVar1 != 0) {
            return -1;
          }
          ps_activate_search((ps_decoder_t *)config_local,"_default");
        }
        config_local[1].defn = (ps_arg_t *)"decode";
        ptmr_init((ptmr_t *)&config_local[1].defn);
        ps_local._4_4_ = 0;
      }
    }
  }
  return ps_local._4_4_;
}

Assistant:

int
ps_reinit(ps_decoder_t *ps, ps_config_t *config)
{
    const char *path;
    const char *keyphrase;
    int32 lw;

    /* Enforce only one of keyphrase, kws, fsg, jsgf, allphone, lm */
    if (config) {
        if (ps_config_validate(config) < 0)
            return -1;
    }
    else if (ps->config) {
        if (ps_config_validate(ps->config) < 0)
            return -1;
    }

    if (config && config != ps->config) {
        ps_config_free(ps->config);
        ps->config = ps_config_retain(config);
    }

    /* Set up logging. We need to do this earlier because we want to dump
     * the information to the configured log, not to the stderr. */
    if (config) {
        const char *logfn, *loglevel;
        logfn = ps_config_str(ps->config, "logfn");
        if (logfn) {
            if (err_set_logfile(logfn) < 0) {
                E_ERROR("Cannot redirect log output\n");
                return -1;
            }
        }
        loglevel = ps_config_str(ps->config, "loglevel");
        if (loglevel) {
            if (err_set_loglevel_str(loglevel) == NULL) {
                E_ERROR("Invalid log level: %s\n", loglevel);
                return -1;
            }
        }
    }
    
    ps->mfclogdir = ps_config_str(ps->config, "mfclogdir");
    ps->rawlogdir = ps_config_str(ps->config, "rawlogdir");
    ps->senlogdir = ps_config_str(ps->config, "senlogdir");

    /* Fill in some default arguments. */
    ps_expand_model_config(ps->config);

    /* Print out the config for logging. */
    cmd_ln_log_values_r(ps->config, ps_args());
    
    /* Free old searches (do this before other reinit) */
    ps_free_searches(ps);
    ps->searches = hash_table_new(3, HASH_CASE_YES);

    /* Free old acmod. */
    acmod_free(ps->acmod);
    ps->acmod = NULL;

    /* Free old dictionary (must be done after the two things above) */
    dict_free(ps->dict);
    ps->dict = NULL;

    /* Free d2p */
    dict2pid_free(ps->d2p);
    ps->d2p = NULL;

    /* Logmath computation (used in acmod and search) */
    if (ps->lmath == NULL
        || (logmath_get_base(ps->lmath) !=
            ps_config_float(ps->config, "logbase"))) {
        if (ps->lmath)
            logmath_free(ps->lmath);
        ps->lmath = logmath_init
            (ps_config_float(ps->config, "logbase"), 0, TRUE);
    }

    /* Acoustic model (this is basically everything that
     * uttproc.c, senscr.c, and others used to do) */
    if ((ps->acmod = acmod_init(ps->config, ps->lmath, NULL, NULL)) == NULL)
        return -1;

    if (ps_config_int(ps->config, "pl_window") > 0) {
        /* Initialize an auxiliary phone loop search, which will run in
         * "parallel" with FSG or N-Gram search. */
        if ((ps->phone_loop =
             phone_loop_search_init(ps->config, ps->acmod, ps->dict)) == NULL)
            return -1;
        hash_table_enter(ps->searches,
                         ps_search_name(ps->phone_loop),
                         ps->phone_loop);
    }

    /* Dictionary and triphone mappings (depends on acmod). */
    /* FIXME: pass config, change arguments, implement LTS, etc. */
    if ((ps->dict = dict_init(ps->config, ps->acmod->mdef)) == NULL)
        return -1;
    if ((ps->d2p = dict2pid_build(ps->acmod->mdef, ps->dict)) == NULL)
        return -1;

    lw = ps_config_float(ps->config, "lw");

    /* Determine whether we are starting out in FSG or N-Gram search mode.
     * If neither is used skip search initialization. */

    if ((keyphrase = ps_config_str(ps->config, "keyphrase"))) {
        if (ps_add_keyphrase(ps, PS_DEFAULT_SEARCH, keyphrase))
            return -1;
        ps_activate_search(ps, PS_DEFAULT_SEARCH);
    }
    else if ((path = ps_config_str(ps->config, "kws"))) {
        if (ps_add_kws(ps, PS_DEFAULT_SEARCH, path))
            return -1;
        ps_activate_search(ps, PS_DEFAULT_SEARCH);
    }
    else if ((path = ps_config_str(ps->config, "fsg"))) {
        fsg_model_t *fsg = fsg_model_readfile(path, ps->lmath, lw);
        if (!fsg)
            return -1;
        if (ps_add_fsg(ps, PS_DEFAULT_SEARCH, fsg)) {
            fsg_model_free(fsg);
            return -1;
        }
        fsg_model_free(fsg);
        ps_activate_search(ps, PS_DEFAULT_SEARCH);
    }
    else if ((path = ps_config_str(ps->config, "jsgf"))) {
        if (ps_add_jsgf_file(ps, PS_DEFAULT_SEARCH, path)
            || ps_activate_search(ps, PS_DEFAULT_SEARCH))
            return -1;
    }
    else if ((path = ps_config_str(ps->config, "allphone"))) {
        if (ps_add_allphone_file(ps, PS_DEFAULT_SEARCH, path)
            || ps_activate_search(ps, PS_DEFAULT_SEARCH))
            return -1;
    }
    else if ((path = ps_config_str(ps->config, "lm"))) {
        if (ps_add_lm_file(ps, PS_DEFAULT_SEARCH, path)
            || ps_activate_search(ps, PS_DEFAULT_SEARCH))
            return -1;
    }
    else if ((path = ps_config_str(ps->config, "lmctl"))) {
        const char *name;
        ngram_model_t *lmset;
        ngram_model_set_iter_t *lmset_it;

        if (!(lmset = ngram_model_set_read(ps->config, path, ps->lmath))) {
            E_ERROR("Failed to read language model control file: %s\n", path);
            return -1;
        }

        for(lmset_it = ngram_model_set_iter(lmset);
            lmset_it; lmset_it = ngram_model_set_iter_next(lmset_it)) {    
            ngram_model_t *lm = ngram_model_set_iter_model(lmset_it, &name);            
            E_INFO("adding search %s\n", name);
            if (ps_add_lm(ps, name, lm)) {
                ngram_model_set_iter_free(lmset_it);
        	ngram_model_free(lmset);
                return -1;
            }
        }
        ngram_model_free(lmset);

        name = ps_config_str(ps->config, "lmname");
        if (name)
            ps_activate_search(ps, name);
        else {
            E_ERROR("No default LM name (-lmname) for `-lmctl'\n");
            return -1;
        }
    }

    /* Initialize performance timer. */
    ps->perf.name = "decode";
    ptmr_init(&ps->perf);

    return 0;
}